

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extract.hpp
# Opt level: O3

extraction_result_t * __thiscall
bredis::extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::operator()
          (extraction_result_t *__return_storage_ptr__,
          extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this,
          array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value)

{
  pointer pvVar1;
  undefined8 *puVar2;
  pointer this_00;
  array_holder_t r;
  vector<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
  local_78;
  result_type local_58;
  
  local_78.
  super__Vector_base<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
  ::reserve(&local_78,
            ((long)(value->elements).
                   super__Vector_base<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>,_std::allocator<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(value->elements).
                   super__Vector_base<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>,_std::allocator<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111);
  this_00 = (value->elements).
            super__Vector_base<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>,_std::allocator<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (value->elements).
           super__Vector_base<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>,_std::allocator<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pvVar1) {
    do {
      boost::
      variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>>>
      ::
      apply_visitor<bredis::extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>const>
                (&local_58,
                 (variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>>>
                  *)this_00,this);
      std::
      vector<boost::variant<long,bredis::extracts::string_t,bredis::extracts::error_t,bredis::extracts::nil_t,boost::recursive_wrapper<bredis::extracts::array_holder_t>>,std::allocator<boost::variant<long,bredis::extracts::string_t,bredis::extracts::error_t,bredis::extracts::nil_t,boost::recursive_wrapper<bredis::extracts::array_holder_t>>>>
      ::
      emplace_back<boost::variant<long,bredis::extracts::string_t,bredis::extracts::error_t,bredis::extracts::nil_t,boost::recursive_wrapper<bredis::extracts::array_holder_t>>>
                ((vector<boost::variant<long,bredis::extracts::string_t,bredis::extracts::error_t,bredis::extracts::nil_t,boost::recursive_wrapper<bredis::extracts::array_holder_t>>,std::allocator<boost::variant<long,bredis::extracts::string_t,bredis::extracts::error_t,bredis::extracts::nil_t,boost::recursive_wrapper<bredis::extracts::array_holder_t>>>>
                  *)&local_78,&local_58);
      boost::
      variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>
      ::destroy_content(&local_58);
      this_00 = this_00 + 1;
    } while (this_00 != pvVar1);
  }
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = local_78.
            super__Vector_base<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2[1] = local_78.
              super__Vector_base<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  puVar2[2] = local_78.
              super__Vector_base<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 **)&(__return_storage_ptr__->storage_).super_aligned_storage_imp<32UL,_8UL>.data_ =
       puVar2;
  __return_storage_ptr__->which_ = 4;
  std::
  vector<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>,_std::allocator<boost::variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>_>_>
  ::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

extracts::extraction_result_t
    operator()(const markers::array_holder_t<Iterator> &value) const {
        extracts::array_holder_t r;
        r.elements.reserve(value.elements.size());
        for (const auto &v : value.elements) {
            r.elements.emplace_back(boost::apply_visitor(*this, v));
        }
        return r;
    }